

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O2

void BamTools::Options::AddValueOption<std::__cxx11::string>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
               OptionGroup *group)

{
  mapped_type *this;
  Option o;
  Variant VStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [16];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined2 local_b0;
  bool local_ae;
  Variant local_a8;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined2 local_40;
  Variant local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  local_a0._8_8_ = 0;
  local_a0[0x10] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._0_1_ = true;
  local_40._1_1_ = false;
  local_38.data = (ImplBase *)0x0;
  std::__cxx11::string::_M_assign((string *)local_a0);
  std::__cxx11::string::_M_assign((string *)&local_80);
  std::__cxx11::string::_M_assign((string *)&local_60);
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            (&group->Options,(value_type *)local_a0);
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0._0_1_ = false;
  local_b0._1_1_ = true;
  local_ae = false;
  local_a8.data = (ImplBase *)0x0;
  local_e0._0_8_ = foundArgument;
  local_e0._8_8_ = val;
  std::__cxx11::string::string((string *)&local_100,(string *)val);
  Variant::Variant<std::__cxx11::string>(&VStack_108,&local_100);
  Variant::operator=(&local_a8,&VStack_108);
  Variant::~Variant(&VStack_108);
  std::__cxx11::string::~string((string *)&local_100);
  local_ae = valueTypeDescription->_M_string_length != 0;
  std::__cxx11::string::_M_assign((string *)&local_d0);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
         ::operator[](&m_optionsMap_abi_cxx11_,argument);
  OptionValue::operator=(this,(OptionValue *)local_e0);
  OptionValue::~OptionValue((OptionValue *)local_e0);
  Option::~Option((Option *)local_a0);
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}